

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrintVisitor.cpp
# Opt level: O2

void __thiscall IRT::PrintVisitor::Visit(PrintVisitor *this,BinopExpression *binop_statement)

{
  ostream *poVar1;
  BinaryOperatorType type;
  string local_48;
  
  PrintTabs(this);
  poVar1 = std::operator<<((ostream *)&this->stream_,"BinopExpression: ");
  ToString_abi_cxx11_(&local_48,(IRT *)(ulong)(uint)(int)(char)binop_statement->operator_type_,type)
  ;
  poVar1 = std::operator<<(poVar1,(string *)&local_48);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)&local_48);
  this->num_tabs_ = this->num_tabs_ + 1;
  (*(binop_statement->first_->super_BaseElement)._vptr_BaseElement[2])(binop_statement->first_,this)
  ;
  (*(binop_statement->second_->super_BaseElement)._vptr_BaseElement[2])
            (binop_statement->second_,this);
  this->num_tabs_ = this->num_tabs_ + -1;
  return;
}

Assistant:

void PrintVisitor::Visit(BinopExpression *binop_statement) {
  PrintTabs();
  stream_ << "BinopExpression: " << ToString(binop_statement->operator_type_) << std::endl;
  ++num_tabs_;
  binop_statement->first_->Accept(this);
  binop_statement->second_->Accept(this);
  --num_tabs_;
}